

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t driver::zesPerformanceFactorGetConfig(zes_perf_handle_t hPerf,double *pFactor)

{
  zes_pfnPerformanceFactorGetConfig_t pfnGetConfig;
  ze_result_t result;
  double *pFactor_local;
  zes_perf_handle_t hPerf_local;
  
  pfnGetConfig._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cbc0 != (code *)0x0) {
    pfnGetConfig._4_4_ = (*DAT_0011cbc0)(hPerf,pFactor);
  }
  return pfnGetConfig._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesPerformanceFactorGetConfig(
        zes_perf_handle_t hPerf,                        ///< [in] Handle for the Performance Factor domain.
        double* pFactor                                 ///< [in,out] Will contain the actual Performance Factor being used by the
                                                        ///< hardware (may not be the same as the requested Performance Factor).
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetConfig = context.zesDdiTable.PerformanceFactor.pfnGetConfig;
        if( nullptr != pfnGetConfig )
        {
            result = pfnGetConfig( hPerf, pFactor );
        }
        else
        {
            // generic implementation
        }

        return result;
    }